

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

string * __thiscall
gl3cts::TextureSwizzle::FunctionalTest::prepareValues_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest *this,size_t format_idx)

{
  ostream *poVar1;
  stringstream local_1d0 [8];
  stringstream stream;
  undefined1 local_1c0 [376];
  double dStack_48;
  double ch_rgba [4];
  size_t format_idx_local;
  FunctionalTest *this_local;
  
  ch_rgba[1] = 0.0;
  ch_rgba[2] = 0.0;
  dStack_48 = 0.0;
  ch_rgba[0] = 0.0;
  calculate_values_from_source(format_idx,&dStack_48);
  std::__cxx11::stringstream::stringstream(local_1d0);
  poVar1 = (ostream *)std::ostream::operator<<(local_1c0,dStack_48);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,ch_rgba[0]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,ch_rgba[1]);
  poVar1 = std::operator<<(poVar1,", ");
  std::ostream::operator<<(poVar1,ch_rgba[2]);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1d0);
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest::prepareValues(size_t format_idx)
{
	double ch_rgba[4] = { 0.0, 0.0, 0.0, 0.0 };

	calculate_values_from_source(format_idx, ch_rgba);

	/* Prepare string */
	std::stringstream stream;
	stream << ch_rgba[0] << ", " << ch_rgba[1] << ", " << ch_rgba[2] << ", " << ch_rgba[3];

	return stream.str();
}